

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_state_fetch_resp(connectdata *conn,int imapcode,imapstate instate)

{
  SessionHandle *data;
  FTP *pFVar1;
  ulong uVar2;
  CURLcode CVar3;
  ulong size;
  size_t sVar4;
  size_t __n;
  ulong uVar5;
  int sockindex;
  char *pcVar6;
  curl_off_t *bytecountp;
  
  data = conn->data;
  if (imapcode == 0x2a) {
    pFVar1 = (data->state).proto.ftp;
    pcVar6 = (data->state).buffer;
    do {
      pcVar6 = pcVar6 + 1;
      if (pcVar6[-1] == '\0') {
        CVar3 = CURLE_FTP_WEIRD_SERVER_REPLY;
        goto LAB_001327e9;
      }
    } while (pcVar6[-1] != '{');
    size = strtol(pcVar6,(char **)0x0,10);
    if (size != 0) {
      Curl_pgrsSetDownloadSize(data,size);
    }
    Curl_infof(data,"Found %lu bytes to download\n",size);
    pcVar6 = (conn->proto).ftpc.pp.cache;
    if (pcVar6 != (char *)0x0) {
      uVar5 = (conn->proto).rtspc.rtp_bufsize;
      if (size <= uVar5) {
        uVar5 = size;
      }
      CVar3 = Curl_client_write(conn,1,pcVar6,uVar5);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      uVar2 = (conn->proto).ftpc.pp.cache_size;
      __n = uVar2 - uVar5;
      if (uVar2 < uVar5 || __n == 0) {
        (*Curl_cfree)((conn->proto).ftpc.pp.cache);
        (conn->proto).ftpc.pp.cache = (char *)0x0;
        sVar4 = 0;
      }
      else {
        memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + uVar5),__n);
        sVar4 = (conn->proto).ftpc.pp.cache_size - uVar5;
      }
      size = size - uVar5;
      (conn->proto).ftpc.pp.cache_size = sVar4;
    }
    Curl_infof(data,"Filesize left: %ld\n",size);
    if (size == 0) {
      sockindex = -1;
      uVar5 = 0xffffffffffffffff;
      bytecountp = (curl_off_t *)0x0;
    }
    else {
      bytecountp = pFVar1->bytecountp;
      sockindex = 0;
      uVar5 = size;
    }
    Curl_setup_transfer(conn,sockindex,uVar5,false,bytecountp,-1,(curl_off_t *)0x0);
    (data->req).maxdownload = size;
    CVar3 = CURLE_OK;
  }
  else {
    CVar3 = CURLE_OK;
    Curl_pgrsSetDownloadSize(data,0);
  }
LAB_001327e9:
  (conn->proto).imapc.state = IMAP_STOP;
  return CVar3;
}

Assistant:

static CURLcode imap_state_fetch_resp(struct connectdata *conn,
                                      int imapcode,
                                      imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct FTP *imap = data->state.proto.imap;
  struct pingpong *pp = &imapc->pp;
  const char *ptr = data->state.buffer;

  (void)instate; /* no use for this yet */

  if('*' != imapcode) {
    Curl_pgrsSetDownloadSize(data, 0);
    state(conn, IMAP_STOP);
    return CURLE_OK;
  }

  /* Something like this comes "* 1 FETCH (BODY[TEXT] {2021}\r" */
  while(*ptr && (*ptr != '{'))
    ptr++;

  if(*ptr == '{') {
    curl_off_t filesize = curlx_strtoofft(ptr+1, NULL, 10);
    if(filesize)
      Curl_pgrsSetDownloadSize(data, filesize);

    infof(data, "Found %" FORMAT_OFF_TU " bytes to download\n", filesize);

    if(pp->cache) {
      /* At this point there is a bunch of data in the header "cache" that is
         actually body content, send it as body and then skip it. Do note
         that there may even be additional "headers" after the body. */
      size_t chunk = pp->cache_size;

      if(chunk > (size_t)filesize)
        /* the conversion from curl_off_t to size_t is always fine here */
        chunk = (size_t)filesize;

      result = Curl_client_write(conn, CLIENTWRITE_BODY, pp->cache, chunk);
      if(result)
        return result;

      filesize -= chunk;

      /* we've now used parts of or the entire cache */
      if(pp->cache_size > chunk) {
        /* part of, move the trailing data to the start and reduce the size */
        memmove(pp->cache, pp->cache+chunk,
                pp->cache_size - chunk);
        pp->cache_size -= chunk;
      }
      else {
        /* cache is drained */
        free(pp->cache);
        pp->cache = NULL;
        pp->cache_size = 0;
      }
    }

    infof(data, "Filesize left: %" FORMAT_OFF_T "\n", filesize);

    if(!filesize)
      /* the entire data is already transferred! */
      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
    else
      /* IMAP download */
      Curl_setup_transfer(conn, FIRSTSOCKET, filesize, FALSE,
                          imap->bytecountp, -1, NULL); /* no upload here */

    data->req.maxdownload = filesize;
  }
  else
    /* We don't know how to parse this line */
    result = CURLE_FTP_WEIRD_SERVER_REPLY; /* TODO: fix this code */

  state(conn, IMAP_STOP);

  return result;
}